

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netmessagemaker.h
# Opt level: O0

CSerializedNetMsg *
NetMsg::Make<CBlockLocator_const&,uint256>(string *msg_type,CBlockLocator *args,uint256 *args_1)

{
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  CSerializedNetMsg *in_RDI;
  long in_FS_OFFSET;
  CSerializedNetMsg *msg;
  CSerializedNetMsg *in_stack_ffffffffffffff88;
  CBlockLocator *in_stack_ffffffffffffff90;
  CSerializedNetMsg *this;
  CSerializedNetMsg *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  __str = in_RDI;
  CSerializedNetMsg::CSerializedNetMsg(in_stack_ffffffffffffff88);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_ffffffffffffffe8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
  VectorWriter::VectorWriter<CBlockLocator_const&,uint256>
            ((VectorWriter *)this,in_RSI,(size_t)in_RDI,in_stack_ffffffffffffff90,
             (uint256 *)in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

CSerializedNetMsg Make(std::string msg_type, Args&&... args)
    {
        CSerializedNetMsg msg;
        msg.m_type = std::move(msg_type);
        VectorWriter{msg.data, 0, std::forward<Args>(args)...};
        return msg;
    }